

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conelinei_intersector.h
# Opt level: O1

bool embree::avx::ConeCurveMiMBIntersector1<8,_true>::occluded
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *line)

{
  undefined8 *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  Geometry *pGVar11;
  long lVar12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  ulong uVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  float fVar45;
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  byte bVar74;
  long lVar75;
  byte bVar76;
  undefined4 uVar77;
  long lVar78;
  ulong uVar79;
  Scene *pSVar80;
  undefined1 auVar81 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  float fVar91;
  undefined1 auVar88 [32];
  float fVar92;
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [16];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  float fVar102;
  float fVar108;
  float fVar110;
  float fVar112;
  float fVar114;
  float fVar116;
  float fVar118;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  float fVar109;
  float fVar111;
  float fVar113;
  float fVar115;
  float fVar117;
  float fVar119;
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  float fVar133;
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [64];
  float fVar134;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [64];
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar152;
  float fVar155;
  float fVar158;
  float fVar161;
  float fVar164;
  float fVar167;
  undefined1 auVar148 [32];
  float fVar153;
  float fVar156;
  float fVar159;
  float fVar162;
  float fVar165;
  float fVar168;
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  float fVar154;
  float fVar157;
  float fVar160;
  float fVar163;
  float fVar166;
  float fVar169;
  undefined1 auVar151 [32];
  float fVar170;
  float fVar171;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  float fVar187;
  float fVar188;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  float fVar197;
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [64];
  float fVar202;
  float fVar203;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  float fVar214;
  float fVar215;
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  undefined1 auVar216 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [64];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  Scene *scene;
  RoundLineIntersectorHitM<8> hit;
  int local_5cc;
  RayQueryContext *local_5c8;
  RTCFilterFunctionNArguments local_5c0;
  undefined4 local_590;
  undefined4 local_58c;
  undefined4 local_588;
  undefined4 local_584;
  undefined4 local_580;
  uint local_57c;
  uint local_578;
  uint local_574;
  uint local_570;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  undefined8 uStack_550;
  undefined8 uStack_548;
  Primitive *local_538;
  Scene *local_530;
  Ray *local_528;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float local_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [32];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  uint uStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [16];
  undefined1 local_250 [16];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  float local_c0;
  float fStack_bc;
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  undefined1 local_a0 [32];
  float local_80;
  float fStack_7c;
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  undefined1 auVar82 [32];
  
  local_528 = ray;
  local_5c8 = context;
  pSVar80 = context->scene;
  uVar2 = line->sharedGeomID;
  local_530 = pSVar80;
  pGVar11 = (pSVar80->geometries).items[uVar2].ptr;
  fVar187 = (pGVar11->time_range).lower;
  fVar187 = pGVar11->fnumTimeSegments *
            (((ray->dir).field_0.m128[3] - fVar187) / ((pGVar11->time_range).upper - fVar187));
  auVar126 = vroundss_avx(ZEXT416((uint)fVar187),ZEXT416((uint)fVar187),9);
  auVar126 = vminss_avx(auVar126,ZEXT416((uint)(pGVar11->fnumTimeSegments + -1.0)));
  auVar126 = vmaxss_avx(ZEXT816(0),auVar126);
  uVar3 = (line->v0).field_0.i[0];
  lVar12 = *(long *)&pGVar11[3].time_range.upper;
  lVar75 = (long)(int)auVar126._0_4_ * 0x38;
  lVar13 = *(long *)(lVar12 + lVar75);
  lVar78 = *(long *)(lVar12 + 0x10 + lVar75);
  uVar4 = (line->v0).field_0.i[1];
  uVar5 = (line->v0).field_0.i[2];
  uVar6 = (line->v0).field_0.i[4];
  puVar1 = (undefined8 *)(lVar13 + lVar78 * (ulong)uVar6);
  uStack_4b0 = *puVar1;
  _local_4c0 = *(undefined1 (*) [16])(lVar13 + lVar78 * (ulong)uVar3);
  uStack_4a8 = puVar1[1];
  uVar7 = (line->v0).field_0.i[5];
  puVar1 = (undefined8 *)(lVar13 + lVar78 * (ulong)uVar7);
  uStack_550 = *puVar1;
  _local_560 = *(undefined1 (*) [16])(lVar13 + lVar78 * (ulong)uVar4);
  uStack_548 = puVar1[1];
  uVar8 = (line->v0).field_0.i[6];
  auVar103._16_16_ = *(undefined1 (*) [16])(lVar13 + lVar78 * (ulong)uVar8);
  auVar103._0_16_ = *(undefined1 (*) [16])(lVar13 + lVar78 * (ulong)uVar5);
  uVar9 = (line->v0).field_0.i[3];
  uVar10 = (line->v0).field_0.i[7];
  auVar99._16_16_ = *(undefined1 (*) [16])(lVar13 + lVar78 * (ulong)uVar10);
  auVar99._0_16_ = *(undefined1 (*) [16])(lVar13 + lVar78 * (ulong)uVar9);
  auVar86._16_16_ = *(undefined1 (*) [16])(lVar13 + lVar78 * (ulong)(uVar6 + 1));
  auVar86._0_16_ = *(undefined1 (*) [16])(lVar13 + lVar78 * (ulong)(uVar3 + 1));
  puVar1 = (undefined8 *)(lVar13 + lVar78 * (ulong)(uVar7 + 1));
  local_440._16_8_ = *puVar1;
  local_440._0_16_ = *(undefined1 (*) [16])(lVar13 + lVar78 * (ulong)(uVar4 + 1));
  local_440._24_8_ = puVar1[1];
  auVar127._16_16_ = *(undefined1 (*) [16])(lVar13 + lVar78 * (ulong)(uVar8 + 1));
  auVar127._0_16_ = *(undefined1 (*) [16])(lVar13 + lVar78 * (ulong)(uVar5 + 1));
  auVar172._16_16_ = *(undefined1 (*) [16])(lVar13 + lVar78 * (ulong)(uVar10 + 1));
  auVar172._0_16_ = *(undefined1 (*) [16])(lVar13 + lVar78 * (ulong)(uVar9 + 1));
  lVar13 = *(long *)(lVar12 + 0x38 + lVar75);
  lVar12 = *(long *)(lVar12 + 0x48 + lVar75);
  auVar189._16_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar6 * lVar12);
  auVar189._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar3 * lVar12);
  lVar78 = (ulong)uVar7 * lVar12;
  auVar198._16_16_ = *(undefined1 (*) [16])(lVar13 + lVar78);
  auVar198._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar4 * lVar12);
  auVar204._16_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar8 * lVar12);
  auVar204._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar5 * lVar12);
  auVar221._16_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar10 * lVar12);
  auVar221._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar9 * lVar12);
  auVar120._16_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)(uVar6 + 1) * lVar12);
  auVar120._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)(uVar3 + 1) * lVar12);
  auVar93._16_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)(uVar8 + 1) * lVar12);
  auVar93._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)(uVar5 + 1) * lVar12);
  fVar187 = fVar187 - auVar126._0_4_;
  auVar34 = vunpcklps_avx(_local_4c0,auVar103);
  auVar32 = vunpckhps_avx(_local_4c0,auVar103);
  auVar35 = vunpcklps_avx(_local_560,auVar99);
  auVar33 = vunpckhps_avx(_local_560,auVar99);
  auVar36 = vunpcklps_avx(auVar34,auVar35);
  auVar34 = vunpckhps_avx(auVar34,auVar35);
  auVar37 = vunpcklps_avx(auVar32,auVar33);
  auVar32 = vunpckhps_avx(auVar32,auVar33);
  auVar38 = vunpcklps_avx(auVar86,auVar127);
  auVar33 = vunpckhps_avx(auVar86,auVar127);
  auVar39 = vunpcklps_avx(local_440,auVar172);
  auVar35 = vunpckhps_avx(local_440,auVar172);
  auVar40 = vunpcklps_avx(auVar38,auVar39);
  auVar38 = vunpckhps_avx(auVar38,auVar39);
  auVar41 = vunpcklps_avx(auVar33,auVar35);
  auVar33 = vunpckhps_avx(auVar33,auVar35);
  auVar42 = vunpcklps_avx(auVar189,auVar204);
  auVar35 = vunpckhps_avx(auVar189,auVar204);
  auVar43 = vunpcklps_avx(auVar198,auVar221);
  auVar39 = vunpckhps_avx(auVar198,auVar221);
  auVar83 = vunpcklps_avx(auVar42,auVar43);
  auVar42 = vunpckhps_avx(auVar42,auVar43);
  auVar82 = vunpcklps_avx(auVar35,auVar39);
  auVar35 = vunpckhps_avx(auVar35,auVar39);
  auVar44 = vunpcklps_avx(auVar120,auVar93);
  auVar39 = vunpckhps_avx(auVar120,auVar93);
  auVar121._16_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)(uVar7 + 1) * lVar12);
  auVar121._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)(uVar4 + 1) * lVar12);
  auVar205._16_16_ = *(undefined1 (*) [16])(lVar13 + lVar12 * (ulong)(uVar10 + 1));
  auVar205._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)(uVar9 + 1) * lVar12);
  auVar84 = vunpcklps_avx(auVar121,auVar205);
  auVar43 = vunpckhps_avx(auVar121,auVar205);
  auVar86 = vunpcklps_avx(auVar44,auVar84);
  auVar44 = vunpckhps_avx(auVar44,auVar84);
  auVar84 = vunpcklps_avx(auVar39,auVar43);
  auVar39 = vunpckhps_avx(auVar39,auVar43);
  auVar126 = vshufps_avx(ZEXT416((uint)fVar187),ZEXT416((uint)fVar187),0);
  auVar31 = vshufps_avx(ZEXT416((uint)(1.0 - fVar187)),ZEXT416((uint)(1.0 - fVar187)),0);
  fVar187 = auVar126._0_4_;
  fVar203 = auVar126._4_4_;
  fVar171 = auVar126._8_4_;
  fVar102 = auVar126._12_4_;
  fVar110 = auVar83._28_4_;
  fVar208 = auVar31._0_4_;
  fVar215 = auVar31._4_4_;
  fVar91 = auVar31._8_4_;
  fVar108 = auVar31._12_4_;
  auVar148._0_4_ = auVar36._0_4_ * fVar208 + auVar83._0_4_ * fVar187;
  auVar148._4_4_ = auVar36._4_4_ * fVar215 + auVar83._4_4_ * fVar203;
  auVar148._8_4_ = auVar36._8_4_ * fVar91 + auVar83._8_4_ * fVar171;
  auVar148._12_4_ = auVar36._12_4_ * fVar108 + auVar83._12_4_ * fVar102;
  auVar148._16_4_ = auVar36._16_4_ * fVar208 + auVar83._16_4_ * fVar187;
  auVar148._20_4_ = auVar36._20_4_ * fVar215 + auVar83._20_4_ * fVar203;
  auVar148._24_4_ = auVar36._24_4_ * fVar91 + auVar83._24_4_ * fVar171;
  auVar148._28_4_ = auVar36._28_4_ + fVar110;
  auVar128._0_4_ = auVar34._0_4_ * fVar208 + fVar187 * auVar42._0_4_;
  auVar128._4_4_ = auVar34._4_4_ * fVar215 + fVar203 * auVar42._4_4_;
  auVar128._8_4_ = auVar34._8_4_ * fVar91 + fVar171 * auVar42._8_4_;
  auVar128._12_4_ = auVar34._12_4_ * fVar108 + fVar102 * auVar42._12_4_;
  auVar128._16_4_ = auVar34._16_4_ * fVar208 + fVar187 * auVar42._16_4_;
  auVar128._20_4_ = auVar34._20_4_ * fVar215 + fVar203 * auVar42._20_4_;
  auVar128._24_4_ = auVar34._24_4_ * fVar91 + fVar171 * auVar42._24_4_;
  auVar128._28_4_ = fVar110 + auVar42._28_4_;
  auVar199._0_4_ = auVar37._0_4_ * fVar208 + auVar82._0_4_ * fVar187;
  auVar199._4_4_ = auVar37._4_4_ * fVar215 + auVar82._4_4_ * fVar203;
  auVar199._8_4_ = auVar37._8_4_ * fVar91 + auVar82._8_4_ * fVar171;
  auVar199._12_4_ = auVar37._12_4_ * fVar108 + auVar82._12_4_ * fVar102;
  auVar199._16_4_ = auVar37._16_4_ * fVar208 + auVar82._16_4_ * fVar187;
  auVar199._20_4_ = auVar37._20_4_ * fVar215 + auVar82._20_4_ * fVar203;
  auVar199._24_4_ = auVar37._24_4_ * fVar91 + auVar82._24_4_ * fVar171;
  auVar199._28_4_ = fVar110 + auVar82._28_4_;
  auVar190._8_4_ = 0x3f800000;
  auVar190._0_8_ = &DAT_3f8000003f800000;
  auVar190._12_4_ = 0x3f800000;
  auVar190._16_4_ = 0x3f800000;
  auVar190._20_4_ = 0x3f800000;
  auVar190._24_4_ = 0x3f800000;
  auVar190._28_4_ = 0x3f800000;
  local_560._0_4_ = fVar208 * auVar32._0_4_ + fVar187 * auVar35._0_4_;
  local_560._4_4_ = fVar215 * auVar32._4_4_ + fVar203 * auVar35._4_4_;
  fStack_558 = fVar91 * auVar32._8_4_ + fVar171 * auVar35._8_4_;
  fStack_554 = fVar108 * auVar32._12_4_ + fVar102 * auVar35._12_4_;
  uStack_550._0_4_ = fVar208 * auVar32._16_4_ + fVar187 * auVar35._16_4_;
  uStack_550._4_4_ = fVar215 * auVar32._20_4_ + fVar203 * auVar35._20_4_;
  uStack_548._0_4_ = fVar91 * auVar32._24_4_ + fVar171 * auVar35._24_4_;
  uStack_548._4_4_ = auVar32._28_4_ + auVar35._28_4_;
  auVar206._0_4_ = fVar208 * auVar40._0_4_ + auVar86._0_4_ * fVar187;
  auVar206._4_4_ = fVar215 * auVar40._4_4_ + auVar86._4_4_ * fVar203;
  auVar206._8_4_ = fVar91 * auVar40._8_4_ + auVar86._8_4_ * fVar171;
  auVar206._12_4_ = fVar108 * auVar40._12_4_ + auVar86._12_4_ * fVar102;
  auVar206._16_4_ = fVar208 * auVar40._16_4_ + auVar86._16_4_ * fVar187;
  auVar206._20_4_ = fVar215 * auVar40._20_4_ + auVar86._20_4_ * fVar203;
  auVar206._24_4_ = fVar91 * auVar40._24_4_ + auVar86._24_4_ * fVar171;
  auVar206._28_4_ = auVar40._28_4_ + uStack_548._4_4_;
  local_4c0._0_4_ = auVar38._0_4_;
  local_4c0._4_4_ = auVar38._4_4_;
  fStack_4b8 = auVar38._8_4_;
  fStack_4b4 = auVar38._12_4_;
  uStack_4b0._0_4_ = auVar38._16_4_;
  uStack_4b0._4_4_ = auVar38._20_4_;
  uStack_4a8._0_4_ = auVar38._24_4_;
  auVar216._0_4_ = fVar208 * (float)local_4c0._0_4_ + auVar44._0_4_ * fVar187;
  auVar216._4_4_ = fVar215 * (float)local_4c0._4_4_ + auVar44._4_4_ * fVar203;
  auVar216._8_4_ = fVar91 * fStack_4b8 + auVar44._8_4_ * fVar171;
  auVar216._12_4_ = fVar108 * fStack_4b4 + auVar44._12_4_ * fVar102;
  auVar216._16_4_ = fVar208 * (float)uStack_4b0 + auVar44._16_4_ * fVar187;
  auVar216._20_4_ = fVar215 * uStack_4b0._4_4_ + auVar44._20_4_ * fVar203;
  auVar216._24_4_ = fVar91 * (float)uStack_4a8 + auVar44._24_4_ * fVar171;
  auVar216._28_4_ = uStack_548._4_4_ + auVar32._28_4_;
  local_4a0._0_4_ = auVar41._0_4_;
  local_4a0._4_4_ = auVar41._4_4_;
  fStack_498 = auVar41._8_4_;
  fStack_494 = auVar41._12_4_;
  fStack_490 = auVar41._16_4_;
  fStack_48c = auVar41._20_4_;
  fStack_488 = auVar41._24_4_;
  auVar222._0_4_ = fVar208 * (float)local_4a0._0_4_ + fVar187 * auVar84._0_4_;
  auVar222._4_4_ = fVar215 * (float)local_4a0._4_4_ + fVar203 * auVar84._4_4_;
  auVar222._8_4_ = fVar91 * fStack_498 + fVar171 * auVar84._8_4_;
  auVar222._12_4_ = fVar108 * fStack_494 + fVar102 * auVar84._12_4_;
  auVar222._16_4_ = fVar208 * fStack_490 + fVar187 * auVar84._16_4_;
  auVar222._20_4_ = fVar215 * fStack_48c + fVar203 * auVar84._20_4_;
  auVar222._24_4_ = fVar91 * fStack_488 + fVar171 * auVar84._24_4_;
  auVar222._28_4_ = uStack_548._4_4_ + auVar84._28_4_;
  local_520._0_4_ = auVar33._0_4_;
  local_520._4_4_ = auVar33._4_4_;
  fStack_518 = auVar33._8_4_;
  fStack_514 = auVar33._12_4_;
  fStack_510 = auVar33._16_4_;
  fStack_50c = auVar33._20_4_;
  fStack_508 = auVar33._24_4_;
  auVar81._0_4_ = fVar208 * (float)local_520._0_4_ + fVar187 * auVar39._0_4_;
  auVar81._4_4_ = fVar215 * (float)local_520._4_4_ + fVar203 * auVar39._4_4_;
  auVar81._8_4_ = fVar91 * fStack_518 + fVar171 * auVar39._8_4_;
  auVar81._12_4_ = fVar108 * fStack_514 + fVar102 * auVar39._12_4_;
  auVar82._16_4_ = fVar208 * fStack_510 + fVar187 * auVar39._16_4_;
  auVar82._0_16_ = auVar81;
  auVar82._20_4_ = fVar215 * fStack_50c + fVar203 * auVar39._20_4_;
  auVar82._24_4_ = fVar91 * fStack_508 + fVar171 * auVar39._24_4_;
  auVar82._28_4_ = auVar84._28_4_ + auVar39._28_4_;
  auVar126 = vpcmpeqd_avx(auVar81,auVar81);
  auVar31 = vpcmpeqd_avx(auVar126,*(undefined1 (*) [16])(line->primIDs).field_0.field_1.vl);
  auVar126 = vpcmpeqd_avx(auVar126,*(undefined1 (*) [16])((long)&(line->primIDs).field_0 + 0x10));
  local_538 = line;
  local_250 = vshufps_avx(ZEXT416(uVar2),ZEXT416(uVar2),0);
  local_260 = local_250;
  fVar187 = (ray->org).field_0.m128[1];
  auVar83._4_4_ = fVar187;
  auVar83._0_4_ = fVar187;
  auVar83._8_4_ = fVar187;
  auVar83._12_4_ = fVar187;
  auVar83._16_4_ = fVar187;
  auVar83._20_4_ = fVar187;
  auVar83._24_4_ = fVar187;
  auVar83._28_4_ = fVar187;
  fVar208 = (ray->dir).field_0.m128[2];
  fVar203 = (ray->dir).field_0.m128[0];
  fVar215 = (ray->dir).field_0.m128[1];
  auVar98 = ZEXT416((uint)(fVar203 * fVar203 + fVar215 * fVar215 + fVar208 * fVar208));
  auVar98 = vshufps_avx(auVar98,auVar98,0);
  auVar100._16_16_ = auVar98;
  auVar100._0_16_ = auVar98;
  auVar32 = vrcpps_avx(auVar100);
  auVar87._16_16_ = auVar126;
  auVar87._0_16_ = auVar31;
  fVar102 = auVar32._0_4_;
  fVar108 = auVar32._4_4_;
  auVar33._4_4_ = fVar108 * auVar98._4_4_;
  auVar33._0_4_ = fVar102 * auVar98._0_4_;
  fVar110 = auVar32._8_4_;
  auVar33._8_4_ = fVar110 * auVar98._8_4_;
  fVar112 = auVar32._12_4_;
  auVar33._12_4_ = fVar112 * auVar98._12_4_;
  fVar114 = auVar32._16_4_;
  auVar33._16_4_ = fVar114 * auVar98._0_4_;
  fVar116 = auVar32._20_4_;
  auVar33._20_4_ = fVar116 * auVar98._4_4_;
  fVar118 = auVar32._24_4_;
  auVar33._24_4_ = fVar118 * auVar98._8_4_;
  auVar33._28_4_ = auVar126._12_4_;
  auVar33 = vsubps_avx(auVar190,auVar33);
  fVar91 = auVar32._28_4_ + auVar33._28_4_;
  auVar35._4_4_ = (auVar148._4_4_ + auVar206._4_4_) * 0.5;
  auVar35._0_4_ = (auVar148._0_4_ + auVar206._0_4_) * 0.5;
  auVar35._8_4_ = (auVar148._8_4_ + auVar206._8_4_) * 0.5;
  auVar35._12_4_ = (auVar148._12_4_ + auVar206._12_4_) * 0.5;
  auVar35._16_4_ = (auVar148._16_4_ + auVar206._16_4_) * 0.5;
  auVar35._20_4_ = (auVar148._20_4_ + auVar206._20_4_) * 0.5;
  auVar35._24_4_ = (auVar148._24_4_ + auVar206._24_4_) * 0.5;
  auVar35._28_4_ = auVar148._28_4_ + auVar206._28_4_;
  auVar32._4_4_ = (auVar216._4_4_ + auVar128._4_4_) * 0.5;
  auVar32._0_4_ = (auVar216._0_4_ + auVar128._0_4_) * 0.5;
  auVar32._8_4_ = (auVar216._8_4_ + auVar128._8_4_) * 0.5;
  auVar32._12_4_ = (auVar216._12_4_ + auVar128._12_4_) * 0.5;
  auVar32._16_4_ = (auVar216._16_4_ + auVar128._16_4_) * 0.5;
  auVar32._20_4_ = (auVar216._20_4_ + auVar128._20_4_) * 0.5;
  auVar32._24_4_ = (auVar216._24_4_ + auVar128._24_4_) * 0.5;
  auVar32._28_4_ = auVar216._28_4_ + auVar128._28_4_;
  auVar34._4_4_ = (auVar199._4_4_ + auVar222._4_4_) * 0.5;
  auVar34._0_4_ = (auVar199._0_4_ + auVar222._0_4_) * 0.5;
  auVar34._8_4_ = (auVar199._8_4_ + auVar222._8_4_) * 0.5;
  auVar34._12_4_ = (auVar199._12_4_ + auVar222._12_4_) * 0.5;
  auVar34._16_4_ = (auVar199._16_4_ + auVar222._16_4_) * 0.5;
  auVar34._20_4_ = (auVar199._20_4_ + auVar222._20_4_) * 0.5;
  auVar34._24_4_ = (auVar199._24_4_ + auVar222._24_4_) * 0.5;
  auVar34._28_4_ = auVar199._28_4_ + auVar222._28_4_;
  fVar208 = (ray->org).field_0.m128[2];
  auVar122._4_4_ = fVar208;
  auVar122._0_4_ = fVar208;
  auVar122._8_4_ = fVar208;
  auVar122._12_4_ = fVar208;
  auVar122._16_4_ = fVar208;
  auVar122._20_4_ = fVar208;
  auVar122._24_4_ = fVar208;
  auVar122._28_4_ = fVar208;
  auVar32 = vsubps_avx(auVar32,auVar83);
  auVar34 = vsubps_avx(auVar34,auVar122);
  fVar203 = (ray->dir).field_0.m128[2];
  fVar215 = (ray->dir).field_0.m128[1];
  fVar171 = (ray->org).field_0.m128[0];
  auVar104._4_4_ = fVar171;
  auVar104._0_4_ = fVar171;
  auVar104._8_4_ = fVar171;
  auVar104._12_4_ = fVar171;
  auVar104._16_4_ = fVar171;
  auVar104._20_4_ = fVar171;
  auVar104._24_4_ = fVar171;
  auVar104._28_4_ = fVar171;
  local_120 = (ray->dir).field_0.m128[0];
  auVar35 = vsubps_avx(auVar35,auVar104);
  fStack_464 = auVar35._28_4_ + auVar32._28_4_ + auVar34._28_4_;
  local_480 = (auVar35._0_4_ * local_120 + fVar215 * auVar32._0_4_ + fVar203 * auVar34._0_4_) *
              (fVar102 + fVar102 * auVar33._0_4_);
  fStack_47c = (auVar35._4_4_ * local_120 + fVar215 * auVar32._4_4_ + fVar203 * auVar34._4_4_) *
               (fVar108 + fVar108 * auVar33._4_4_);
  fStack_478 = (auVar35._8_4_ * local_120 + fVar215 * auVar32._8_4_ + fVar203 * auVar34._8_4_) *
               (fVar110 + fVar110 * auVar33._8_4_);
  fStack_474 = (auVar35._12_4_ * local_120 + fVar215 * auVar32._12_4_ + fVar203 * auVar34._12_4_) *
               (fVar112 + fVar112 * auVar33._12_4_);
  fStack_470 = (auVar35._16_4_ * local_120 + fVar215 * auVar32._16_4_ + fVar203 * auVar34._16_4_) *
               (fVar114 + fVar114 * auVar33._16_4_);
  fStack_46c = (auVar35._20_4_ * local_120 + fVar215 * auVar32._20_4_ + fVar203 * auVar34._20_4_) *
               (fVar116 + fVar116 * auVar33._20_4_);
  fStack_468 = (auVar35._24_4_ * local_120 + fVar215 * auVar32._24_4_ + fVar203 * auVar34._24_4_) *
               (fVar118 + fVar118 * auVar33._24_4_);
  auVar173._0_4_ = fVar171 + local_120 * local_480;
  auVar173._4_4_ = fVar171 + local_120 * fStack_47c;
  auVar173._8_4_ = fVar171 + local_120 * fStack_478;
  auVar173._12_4_ = fVar171 + local_120 * fStack_474;
  auVar173._16_4_ = fVar171 + local_120 * fStack_470;
  auVar173._20_4_ = fVar171 + local_120 * fStack_46c;
  auVar173._24_4_ = fVar171 + local_120 * fStack_468;
  auVar173._28_4_ = fVar171 + fVar91;
  auVar88._0_4_ = fVar187 + fVar215 * local_480;
  auVar88._4_4_ = fVar187 + fVar215 * fStack_47c;
  auVar88._8_4_ = fVar187 + fVar215 * fStack_478;
  auVar88._12_4_ = fVar187 + fVar215 * fStack_474;
  auVar88._16_4_ = fVar187 + fVar215 * fStack_470;
  auVar88._20_4_ = fVar187 + fVar215 * fStack_46c;
  auVar88._24_4_ = fVar187 + fVar215 * fStack_468;
  auVar88._28_4_ = fVar187 + fVar91;
  auVar84._0_4_ = fVar208 + fVar203 * local_480;
  auVar84._4_4_ = fVar208 + fVar203 * fStack_47c;
  auVar84._8_4_ = fVar208 + fVar203 * fStack_478;
  auVar84._12_4_ = fVar208 + fVar203 * fStack_474;
  auVar84._16_4_ = fVar208 + fVar203 * fStack_470;
  auVar84._20_4_ = fVar208 + fVar203 * fStack_46c;
  auVar84._24_4_ = fVar208 + fVar203 * fStack_468;
  auVar84._28_4_ = fVar208 + fVar187;
  local_160 = vsubps_avx(auVar216,auVar128);
  _local_4a0 = vsubps_avx(auVar222,auVar199);
  fVar187 = local_4a0._0_4_;
  fVar110 = local_4a0._4_4_;
  fVar218 = local_4a0._8_4_;
  fVar157 = local_4a0._12_4_;
  fVar16 = local_4a0._16_4_;
  fVar21 = local_4a0._20_4_;
  fVar26 = local_4a0._24_4_;
  fVar208 = local_160._0_4_;
  fVar112 = local_160._4_4_;
  fVar219 = local_160._8_4_;
  fVar160 = local_160._12_4_;
  fVar17 = local_160._16_4_;
  fVar22 = local_160._20_4_;
  fVar27 = local_160._24_4_;
  local_440 = vsubps_avx(auVar206,auVar148);
  fVar91 = local_440._0_4_;
  fVar114 = local_440._4_4_;
  fVar220 = local_440._8_4_;
  fVar163 = local_440._12_4_;
  fVar18 = local_440._16_4_;
  fVar23 = local_440._20_4_;
  fVar28 = local_440._24_4_;
  local_520._0_4_ = fVar91 * fVar91 + fVar208 * fVar208 + fVar187 * fVar187;
  local_520._4_4_ = fVar114 * fVar114 + fVar112 * fVar112 + fVar110 * fVar110;
  fStack_518 = fVar220 * fVar220 + fVar219 * fVar219 + fVar218 * fVar218;
  fStack_514 = fVar163 * fVar163 + fVar160 * fVar160 + fVar157 * fVar157;
  fStack_510 = fVar18 * fVar18 + fVar17 * fVar17 + fVar16 * fVar16;
  fStack_50c = fVar23 * fVar23 + fVar22 * fVar22 + fVar21 * fVar21;
  fStack_508 = fVar28 * fVar28 + fVar27 * fVar27 + fVar26 * fVar26;
  fStack_504 = fStack_464 + fStack_464 + fVar171;
  _local_360 = vsubps_avx(auVar88,auVar128);
  _local_420 = vsubps_avx(auVar84,auVar199);
  fVar171 = local_420._0_4_;
  fVar116 = local_420._4_4_;
  fVar178 = local_420._8_4_;
  fVar180 = local_420._12_4_;
  fVar182 = local_420._16_4_;
  fVar184 = local_420._20_4_;
  fVar186 = local_420._24_4_;
  fVar102 = local_360._0_4_;
  fVar118 = local_360._4_4_;
  fVar147 = local_360._8_4_;
  fVar166 = local_360._12_4_;
  fVar19 = local_360._16_4_;
  fVar24 = local_360._20_4_;
  fVar29 = local_360._24_4_;
  _local_4c0 = vsubps_avx(auVar173,auVar148);
  fVar145 = local_4c0._0_4_;
  fVar152 = local_4c0._4_4_;
  fVar155 = local_4c0._8_4_;
  fVar158 = local_4c0._12_4_;
  fVar161 = local_4c0._16_4_;
  fVar164 = local_4c0._20_4_;
  fVar167 = local_4c0._24_4_;
  fVar202 = fVar145 * fVar91 + fVar208 * fVar102 + fVar187 * fVar171;
  fVar207 = fVar152 * fVar114 + fVar112 * fVar118 + fVar110 * fVar116;
  fVar209 = fVar155 * fVar220 + fVar219 * fVar147 + fVar218 * fVar178;
  fVar210 = fVar158 * fVar163 + fVar160 * fVar166 + fVar157 * fVar180;
  fVar211 = fVar161 * fVar18 + fVar17 * fVar19 + fVar16 * fVar182;
  fVar212 = fVar164 * fVar23 + fVar22 * fVar24 + fVar21 * fVar184;
  fVar213 = fVar167 * fVar28 + fVar27 * fVar29 + fVar26 * fVar186;
  fVar214 = fStack_464 + fStack_464 + auVar88._28_4_;
  fVar92 = fStack_464 + fStack_464 + auVar88._28_4_;
  auVar200._0_4_ = fVar91 * local_120 + fVar208 * fVar215 + fVar187 * fVar203;
  auVar200._4_4_ = fVar114 * local_120 + fVar112 * fVar215 + fVar110 * fVar203;
  auVar200._8_4_ = fVar220 * local_120 + fVar219 * fVar215 + fVar218 * fVar203;
  auVar200._12_4_ = fVar163 * local_120 + fVar160 * fVar215 + fVar157 * fVar203;
  auVar200._16_4_ = fVar18 * local_120 + fVar17 * fVar215 + fVar16 * fVar203;
  auVar200._20_4_ = fVar23 * local_120 + fVar22 * fVar215 + fVar21 * fVar203;
  auVar200._24_4_ = fVar28 * local_120 + fVar27 * fVar215 + fVar26 * fVar203;
  auVar200._28_4_ = fStack_464 + fVar92;
  local_3e0 = fVar203;
  fStack_3dc = fVar203;
  fStack_3d8 = fVar203;
  fStack_3d4 = fVar203;
  fStack_3d0 = fVar203;
  fStack_3cc = fVar203;
  fStack_3c8 = fVar203;
  fStack_3c4 = fVar203;
  local_400 = fVar215;
  fStack_3fc = fVar215;
  fStack_3f8 = fVar215;
  fStack_3f4 = fVar215;
  fStack_3f0 = fVar215;
  fStack_3ec = fVar215;
  fStack_3e8 = fVar215;
  fStack_3e4 = fVar215;
  fStack_11c = local_120;
  fStack_118 = local_120;
  fStack_114 = local_120;
  fStack_110 = local_120;
  fStack_10c = local_120;
  fStack_108 = local_120;
  fStack_104 = local_120;
  auVar83 = _local_420;
  fVar45 = local_440._28_4_;
  auVar32 = vsubps_avx(_local_560,auVar82);
  fVar108 = auVar32._0_4_;
  fVar217 = auVar32._4_4_;
  fVar154 = auVar32._8_4_;
  fVar169 = auVar32._12_4_;
  fVar20 = auVar32._16_4_;
  fVar25 = auVar32._20_4_;
  fVar30 = auVar32._24_4_;
  fVar188 = fVar108 * fVar108 + (float)local_520._0_4_;
  fVar191 = fVar217 * fVar217 + (float)local_520._4_4_;
  fVar192 = fVar154 * fVar154 + fStack_518;
  fVar193 = fVar169 * fVar169 + fStack_514;
  fVar194 = fVar20 * fVar20 + fStack_510;
  fVar195 = fVar25 * fVar25 + fStack_50c;
  fVar196 = fVar30 * fVar30 + fStack_508;
  fVar146 = (float)local_520._0_4_ * (float)local_520._0_4_;
  fVar153 = (float)local_520._4_4_ * (float)local_520._4_4_;
  local_140._4_4_ = fVar153;
  local_140._0_4_ = fVar146;
  fVar156 = fStack_518 * fStack_518;
  fStack_138 = fVar156;
  fVar159 = fStack_514 * fStack_514;
  fStack_134 = fVar159;
  fVar162 = fStack_510 * fStack_510;
  fStack_130 = fVar162;
  fVar165 = fStack_50c * fStack_50c;
  fStack_12c = fVar165;
  fVar197 = local_4c0._28_4_;
  fVar168 = fStack_508 * fStack_508;
  fStack_128 = fVar168;
  uStack_124 = fVar197;
  auVar38._4_4_ = fVar153 * (fVar152 * local_120 + fVar215 * fVar118 + fVar203 * fVar116);
  auVar38._0_4_ = fVar146 * (fVar145 * local_120 + fVar215 * fVar102 + fVar203 * fVar171);
  auVar38._8_4_ = fVar156 * (fVar155 * local_120 + fVar215 * fVar147 + fVar203 * fVar178);
  auVar38._12_4_ = fVar159 * (fVar158 * local_120 + fVar215 * fVar166 + fVar203 * fVar180);
  auVar38._16_4_ = fVar162 * (fVar161 * local_120 + fVar215 * fVar19 + fVar203 * fVar182);
  auVar38._20_4_ = fVar165 * (fVar164 * local_120 + fVar215 * fVar24 + fVar203 * fVar184);
  auVar38._24_4_ = fVar168 * (fVar167 * local_120 + fVar215 * fVar29 + fVar203 * fVar186);
  auVar38._28_4_ = fStack_464 + fStack_464 + fVar92;
  auVar39._4_4_ = fVar191 * auVar200._4_4_ * fVar207;
  auVar39._0_4_ = fVar188 * auVar200._0_4_ * fVar202;
  auVar39._8_4_ = fVar192 * auVar200._8_4_ * fVar209;
  auVar39._12_4_ = fVar193 * auVar200._12_4_ * fVar210;
  auVar39._16_4_ = fVar194 * auVar200._16_4_ * fVar211;
  auVar39._20_4_ = fVar195 * auVar200._20_4_ * fVar212;
  auVar39._24_4_ = fVar196 * auVar200._24_4_ * fVar213;
  auVar39._28_4_ = fVar45;
  auVar33 = vsubps_avx(auVar38,auVar39);
  fVar92 = (float)local_560._0_4_ * (float)local_520._0_4_;
  fVar109 = (float)local_560._4_4_ * (float)local_520._4_4_;
  auVar42._4_4_ = fVar109;
  auVar42._0_4_ = fVar92;
  fVar111 = fStack_558 * fStack_518;
  auVar42._8_4_ = fVar111;
  fVar113 = fStack_554 * fStack_514;
  auVar42._12_4_ = fVar113;
  fVar115 = (float)uStack_550 * fStack_510;
  auVar42._16_4_ = fVar115;
  fVar117 = uStack_550._4_4_ * fStack_50c;
  auVar42._20_4_ = fVar117;
  fVar119 = (float)uStack_548 * fStack_508;
  auVar42._24_4_ = fVar119;
  auVar42._28_4_ = fVar45;
  auVar89._0_4_ = fVar92 * auVar200._0_4_ * fVar108 + auVar33._0_4_;
  auVar89._4_4_ = fVar109 * auVar200._4_4_ * fVar217 + auVar33._4_4_;
  auVar89._8_4_ = fVar111 * auVar200._8_4_ * fVar154 + auVar33._8_4_;
  auVar89._12_4_ = fVar113 * auVar200._12_4_ * fVar169 + auVar33._12_4_;
  auVar89._16_4_ = fVar115 * auVar200._16_4_ * fVar20 + auVar33._16_4_;
  auVar89._20_4_ = fVar117 * auVar200._20_4_ * fVar25 + auVar33._20_4_;
  auVar89._24_4_ = fVar119 * auVar200._24_4_ * fVar30 + auVar33._24_4_;
  auVar89._28_4_ = uStack_548._4_4_ + auVar33._28_4_;
  auVar43._4_4_ = fVar153 * (fVar152 * fVar152 + fVar118 * fVar118 + fVar116 * fVar116);
  auVar43._0_4_ = fVar146 * (fVar145 * fVar145 + fVar102 * fVar102 + fVar171 * fVar171);
  auVar43._8_4_ = fVar156 * (fVar155 * fVar155 + fVar147 * fVar147 + fVar178 * fVar178);
  auVar43._12_4_ = fVar159 * (fVar158 * fVar158 + fVar166 * fVar166 + fVar180 * fVar180);
  auVar43._16_4_ = fVar162 * (fVar161 * fVar161 + fVar19 * fVar19 + fVar182 * fVar182);
  auVar43._20_4_ = fVar165 * (fVar164 * fVar164 + fVar24 * fVar24 + fVar184 * fVar184);
  auVar43._24_4_ = fVar168 * (fVar167 * fVar167 + fVar29 * fVar29 + fVar186 * fVar186);
  auVar43._28_4_ = fVar45 + fVar45 + fStack_464;
  auVar44._4_4_ = fVar191 * fVar207 * fVar207;
  auVar44._0_4_ = fVar188 * fVar202 * fVar202;
  auVar44._8_4_ = fVar192 * fVar209 * fVar209;
  auVar44._12_4_ = fVar193 * fVar210 * fVar210;
  auVar44._16_4_ = fVar194 * fVar211 * fVar211;
  auVar44._20_4_ = fVar195 * fVar212 * fVar212;
  auVar44._24_4_ = fVar196 * fVar213 * fVar213;
  auVar44._28_4_ = uStack_548._4_4_;
  auVar33 = vsubps_avx(auVar43,auVar44);
  auVar36._4_4_ = fVar207 * (fVar217 + fVar217);
  auVar36._0_4_ = fVar202 * (fVar108 + fVar108);
  auVar36._8_4_ = fVar209 * (fVar154 + fVar154);
  auVar36._12_4_ = fVar210 * (fVar169 + fVar169);
  auVar36._16_4_ = fVar211 * (fVar20 + fVar20);
  auVar36._20_4_ = fVar212 * (fVar25 + fVar25);
  auVar36._24_4_ = fVar213 * (fVar30 + fVar30);
  auVar36._28_4_ = auVar32._28_4_ + auVar32._28_4_;
  auVar32 = vsubps_avx(auVar36,auVar42);
  fVar134 = auVar200._0_4_ * auVar200._0_4_;
  fVar139 = auVar200._4_4_ * auVar200._4_4_;
  fVar140 = auVar200._8_4_ * auVar200._8_4_;
  fVar141 = auVar200._12_4_ * auVar200._12_4_;
  fVar142 = auVar200._16_4_ * auVar200._16_4_;
  fVar143 = auVar200._20_4_ * auVar200._20_4_;
  fVar144 = auVar200._24_4_ * auVar200._24_4_;
  auVar37._4_4_ = fVar191 * fVar139;
  auVar37._0_4_ = fVar188 * fVar134;
  auVar37._8_4_ = fVar192 * fVar140;
  auVar37._12_4_ = fVar193 * fVar141;
  auVar37._16_4_ = fVar194 * fVar142;
  auVar37._20_4_ = fVar195 * fVar143;
  auVar37._24_4_ = fVar196 * fVar144;
  auVar37._28_4_ = fVar45;
  auVar34 = vsubps_avx(_local_140,auVar37);
  auVar40._4_4_ = auVar34._4_4_ * (auVar33._4_4_ + fVar109 * auVar32._4_4_);
  auVar40._0_4_ = auVar34._0_4_ * (auVar33._0_4_ + fVar92 * auVar32._0_4_);
  auVar40._8_4_ = auVar34._8_4_ * (auVar33._8_4_ + fVar111 * auVar32._8_4_);
  auVar40._12_4_ = auVar34._12_4_ * (auVar33._12_4_ + fVar113 * auVar32._12_4_);
  auVar40._16_4_ = auVar34._16_4_ * (auVar33._16_4_ + fVar115 * auVar32._16_4_);
  auVar40._20_4_ = auVar34._20_4_ * (auVar33._20_4_ + fVar117 * auVar32._20_4_);
  auVar40._24_4_ = auVar34._24_4_ * (auVar33._24_4_ + fVar119 * auVar32._24_4_);
  auVar40._28_4_ = auVar33._28_4_ + fVar45;
  auVar41._4_4_ = auVar89._4_4_ * auVar89._4_4_;
  auVar41._0_4_ = auVar89._0_4_ * auVar89._0_4_;
  auVar41._8_4_ = auVar89._8_4_ * auVar89._8_4_;
  auVar41._12_4_ = auVar89._12_4_ * auVar89._12_4_;
  auVar41._16_4_ = auVar89._16_4_ * auVar89._16_4_;
  auVar41._20_4_ = auVar89._20_4_ * auVar89._20_4_;
  auVar41._24_4_ = auVar89._24_4_ * auVar89._24_4_;
  auVar41._28_4_ = fVar45;
  auVar33 = vsubps_avx(auVar41,auVar40);
  uVar79 = (ulong)((line->rightExists & 0xf) << 4);
  auVar32 = vcmpps_avx(auVar33,ZEXT432(0) << 0x20,5);
  auVar35 = auVar32 & ~auVar87;
  if ((((((((auVar35 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar35 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar35 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar35 >> 0x7f,0) != '\0') ||
        (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar35 >> 0xbf,0) != '\0') ||
      (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar35[0x1f] < '\0') {
    fStack_2f4 = (float)((ulong)*(undefined8 *)(mm_lookupmask_ps + uVar79 + 8) >> 0x20);
    auVar35 = vandnps_avx(auVar87,auVar32);
    auVar42 = vsubps_avx(auVar173,auVar206);
    auVar43 = vsubps_avx(auVar88,auVar216);
    auVar44 = vsubps_avx(auVar84,auVar222);
    fVar170 = auVar42._0_4_ * fVar91 + auVar44._0_4_ * fVar187 + fVar208 * auVar43._0_4_;
    fVar176 = auVar42._4_4_ * fVar114 + auVar44._4_4_ * fVar110 + fVar112 * auVar43._4_4_;
    fVar177 = auVar42._8_4_ * fVar220 + auVar44._8_4_ * fVar218 + fVar219 * auVar43._8_4_;
    fVar179 = auVar42._12_4_ * fVar163 + auVar44._12_4_ * fVar157 + fVar160 * auVar43._12_4_;
    fVar181 = auVar42._16_4_ * fVar18 + auVar44._16_4_ * fVar16 + fVar17 * auVar43._16_4_;
    fVar183 = auVar42._20_4_ * fVar23 + auVar44._20_4_ * fVar21 + fVar22 * auVar43._20_4_;
    fVar185 = auVar42._24_4_ * fVar28 + auVar44._24_4_ * fVar26 + fVar27 * auVar43._24_4_;
    auVar33 = vsqrtps_avx(auVar33);
    auVar32 = vrcpps_avx(auVar34);
    fVar92 = auVar32._0_4_;
    fVar109 = auVar32._4_4_;
    auVar46._4_4_ = auVar34._4_4_ * fVar109;
    auVar46._0_4_ = auVar34._0_4_ * fVar92;
    fVar111 = auVar32._8_4_;
    auVar46._8_4_ = auVar34._8_4_ * fVar111;
    fVar113 = auVar32._12_4_;
    auVar46._12_4_ = auVar34._12_4_ * fVar113;
    fVar115 = auVar32._16_4_;
    auVar46._16_4_ = auVar34._16_4_ * fVar115;
    fVar117 = auVar32._20_4_;
    auVar46._20_4_ = auVar34._20_4_ * fVar117;
    fVar119 = auVar32._24_4_;
    auVar46._24_4_ = auVar34._24_4_ * fVar119;
    auVar46._28_4_ = local_160._28_4_;
    auVar94._8_4_ = 0x3f800000;
    auVar94._0_8_ = &DAT_3f8000003f800000;
    auVar94._12_4_ = 0x3f800000;
    auVar94._16_4_ = 0x3f800000;
    auVar94._20_4_ = 0x3f800000;
    auVar94._24_4_ = 0x3f800000;
    auVar94._28_4_ = 0x3f800000;
    auVar38 = vsubps_avx(auVar94,auVar46);
    auVar95._8_4_ = 0x7fffffff;
    auVar95._0_8_ = 0x7fffffff7fffffff;
    auVar95._12_4_ = 0x7fffffff;
    auVar95._16_4_ = 0x7fffffff;
    auVar95._20_4_ = 0x7fffffff;
    auVar95._24_4_ = 0x7fffffff;
    auVar95._28_4_ = 0x7fffffff;
    fVar92 = auVar38._0_4_ * fVar92 + fVar92;
    fVar109 = auVar38._4_4_ * fVar109 + fVar109;
    fVar111 = auVar38._8_4_ * fVar111 + fVar111;
    fVar113 = auVar38._12_4_ * fVar113 + fVar113;
    fVar115 = auVar38._16_4_ * fVar115 + fVar115;
    fVar117 = auVar38._20_4_ * fVar117 + fVar117;
    fVar119 = auVar38._24_4_ * fVar119 + fVar119;
    fVar133 = auVar38._28_4_ + auVar32._28_4_;
    auVar32 = vandps_avx(auVar34,auVar95);
    auVar149._8_4_ = 0x219392ef;
    auVar149._0_8_ = 0x219392ef219392ef;
    auVar149._12_4_ = 0x219392ef;
    auVar149._16_4_ = 0x219392ef;
    auVar149._20_4_ = 0x219392ef;
    auVar149._24_4_ = 0x219392ef;
    auVar149._28_4_ = 0x219392ef;
    auVar32 = vcmpps_avx(auVar32,auVar149,2);
    uVar15 = CONCAT44(auVar89._4_4_,auVar89._0_4_);
    auVar150._0_8_ = uVar15 ^ 0x8000000080000000;
    auVar150._8_4_ = -auVar89._8_4_;
    auVar150._12_4_ = -auVar89._12_4_;
    auVar150._16_4_ = -auVar89._16_4_;
    auVar150._20_4_ = -auVar89._20_4_;
    auVar150._24_4_ = -auVar89._24_4_;
    auVar150._28_4_ = -auVar89._28_4_;
    auVar34 = vsubps_avx(auVar150,auVar33);
    auVar33 = vsubps_avx(auVar33,auVar89);
    auVar47._4_4_ = auVar34._4_4_ * fVar109;
    auVar47._0_4_ = auVar34._0_4_ * fVar92;
    auVar47._8_4_ = auVar34._8_4_ * fVar111;
    auVar47._12_4_ = auVar34._12_4_ * fVar113;
    auVar47._16_4_ = auVar34._16_4_ * fVar115;
    auVar47._20_4_ = auVar34._20_4_ * fVar117;
    auVar47._24_4_ = auVar34._24_4_ * fVar119;
    auVar47._28_4_ = auVar89._28_4_;
    auVar48._4_4_ = auVar33._4_4_ * fVar109;
    auVar48._0_4_ = auVar33._0_4_ * fVar92;
    auVar48._8_4_ = auVar33._8_4_ * fVar111;
    auVar48._12_4_ = auVar33._12_4_ * fVar113;
    auVar48._16_4_ = auVar33._16_4_ * fVar115;
    auVar48._20_4_ = auVar33._20_4_ * fVar117;
    auVar48._24_4_ = auVar33._24_4_ * fVar119;
    auVar48._28_4_ = fVar133;
    auVar224._8_4_ = 0xff800000;
    auVar224._0_8_ = 0xff800000ff800000;
    auVar224._12_4_ = 0xff800000;
    auVar224._16_4_ = 0xff800000;
    auVar224._20_4_ = 0xff800000;
    auVar224._24_4_ = 0xff800000;
    auVar224._28_4_ = 0xff800000;
    auVar33 = vblendvps_avx(auVar47,auVar224,auVar32);
    auVar85._8_4_ = 0x7f800000;
    auVar85._0_8_ = 0x7f8000007f800000;
    auVar85._12_4_ = 0x7f800000;
    auVar85._16_4_ = 0x7f800000;
    auVar85._20_4_ = 0x7f800000;
    auVar85._24_4_ = 0x7f800000;
    auVar85._28_4_ = 0x7f800000;
    auVar34 = vblendvps_avx(auVar48,auVar85,auVar32);
    auVar101._0_4_ = fVar202 + auVar200._0_4_ * auVar33._0_4_;
    auVar101._4_4_ = fVar207 + auVar200._4_4_ * auVar33._4_4_;
    auVar101._8_4_ = fVar209 + auVar200._8_4_ * auVar33._8_4_;
    auVar101._12_4_ = fVar210 + auVar200._12_4_ * auVar33._12_4_;
    auVar101._16_4_ = fVar211 + auVar200._16_4_ * auVar33._16_4_;
    auVar101._20_4_ = fVar212 + auVar200._20_4_ * auVar33._20_4_;
    auVar101._24_4_ = fVar213 + auVar200._24_4_ * auVar33._24_4_;
    auVar101._28_4_ = fVar214 + fVar133;
    auVar32 = vcmpps_avx(auVar101,ZEXT832(0) << 0x20,6);
    auVar38 = vcmpps_avx(auVar101,_local_520,1);
    auVar32 = vandps_avx(auVar38,auVar32);
    auVar32 = vandps_avx(auVar35,auVar32);
    local_4e0 = vblendvps_avx(auVar85,auVar33,auVar32);
    local_3a0._0_4_ = fVar202 + auVar200._0_4_ * auVar34._0_4_;
    local_3a0._4_4_ = fVar207 + auVar200._4_4_ * auVar34._4_4_;
    fStack_398 = fVar209 + auVar200._8_4_ * auVar34._8_4_;
    fStack_394 = fVar210 + auVar200._12_4_ * auVar34._12_4_;
    fStack_390 = fVar211 + auVar200._16_4_ * auVar34._16_4_;
    fStack_38c = fVar212 + auVar200._20_4_ * auVar34._20_4_;
    fStack_388 = fVar213 + auVar200._24_4_ * auVar34._24_4_;
    register0x000012dc = fVar214 + local_4e0._28_4_;
    auVar32 = vcmpps_avx(_local_3a0,ZEXT832(0) << 0x20,6);
    auVar33 = vcmpps_avx(_local_3a0,_local_520,1);
    auVar32 = vandps_avx(auVar33,auVar32);
    auVar32 = vandps_avx(auVar35,auVar32);
    local_500 = vblendvps_avx(auVar224,auVar34,auVar32);
    auVar39 = vrcpps_avx(auVar200);
    fVar92 = auVar39._0_4_;
    fVar109 = auVar39._4_4_;
    auVar49._4_4_ = auVar200._4_4_ * fVar109;
    auVar49._0_4_ = auVar200._0_4_ * fVar92;
    fVar111 = auVar39._8_4_;
    auVar49._8_4_ = auVar200._8_4_ * fVar111;
    fVar113 = auVar39._12_4_;
    auVar49._12_4_ = auVar200._12_4_ * fVar113;
    fVar115 = auVar39._16_4_;
    auVar49._16_4_ = auVar200._16_4_ * fVar115;
    fVar117 = auVar39._20_4_;
    auVar49._20_4_ = auVar200._20_4_ * fVar117;
    fVar119 = auVar39._24_4_;
    auVar49._24_4_ = auVar200._24_4_ * fVar119;
    auVar49._28_4_ = auVar34._28_4_;
    auVar129._8_4_ = 0x3f800000;
    auVar129._0_8_ = &DAT_3f8000003f800000;
    auVar129._12_4_ = 0x3f800000;
    auVar129._16_4_ = 0x3f800000;
    auVar129._20_4_ = 0x3f800000;
    auVar129._24_4_ = 0x3f800000;
    auVar129._28_4_ = 0x3f800000;
    auVar34 = vsubps_avx(auVar129,auVar49);
    fVar92 = fVar92 + fVar92 * auVar34._0_4_;
    fVar109 = fVar109 + fVar109 * auVar34._4_4_;
    fVar111 = fVar111 + fVar111 * auVar34._8_4_;
    fVar113 = fVar113 + fVar113 * auVar34._12_4_;
    fVar115 = fVar115 + fVar115 * auVar34._16_4_;
    fVar117 = fVar117 + fVar117 * auVar34._20_4_;
    fVar119 = fVar119 + fVar119 * auVar34._24_4_;
    auVar50._4_4_ = auVar200._4_4_ * fVar152;
    auVar50._0_4_ = auVar200._0_4_ * fVar145;
    auVar50._8_4_ = auVar200._8_4_ * fVar155;
    auVar50._12_4_ = auVar200._12_4_ * fVar158;
    auVar50._16_4_ = auVar200._16_4_ * fVar161;
    auVar50._20_4_ = auVar200._20_4_ * fVar164;
    auVar50._24_4_ = auVar200._24_4_ * fVar167;
    auVar50._28_4_ = auVar34._28_4_;
    auVar51._4_4_ = local_120 * fVar207;
    auVar51._0_4_ = local_120 * fVar202;
    auVar51._8_4_ = local_120 * fVar209;
    auVar51._12_4_ = local_120 * fVar210;
    auVar51._16_4_ = local_120 * fVar211;
    auVar51._20_4_ = local_120 * fVar212;
    auVar51._24_4_ = local_120 * fVar213;
    auVar51._28_4_ = 0x3f800000;
    auVar32 = vsubps_avx(auVar50,auVar51);
    auVar52._4_4_ = auVar200._4_4_ * fVar118;
    auVar52._0_4_ = auVar200._0_4_ * fVar102;
    auVar52._8_4_ = auVar200._8_4_ * fVar147;
    auVar52._12_4_ = auVar200._12_4_ * fVar166;
    auVar52._16_4_ = auVar200._16_4_ * fVar19;
    auVar52._20_4_ = auVar200._20_4_ * fVar24;
    auVar52._24_4_ = auVar200._24_4_ * fVar29;
    auVar52._28_4_ = 0x3f800000;
    auVar53._4_4_ = fVar215 * fVar207;
    auVar53._0_4_ = fVar215 * fVar202;
    auVar53._8_4_ = fVar215 * fVar209;
    auVar53._12_4_ = fVar215 * fVar210;
    auVar53._16_4_ = fVar215 * fVar211;
    auVar53._20_4_ = fVar215 * fVar212;
    auVar53._24_4_ = fVar215 * fVar213;
    auVar53._28_4_ = auVar38._28_4_;
    auVar36 = vsubps_avx(auVar52,auVar53);
    auVar54._4_4_ = auVar200._4_4_ * fVar116;
    auVar54._0_4_ = auVar200._0_4_ * fVar171;
    auVar54._8_4_ = auVar200._8_4_ * fVar178;
    auVar54._12_4_ = auVar200._12_4_ * fVar180;
    auVar54._16_4_ = auVar200._16_4_ * fVar182;
    auVar54._20_4_ = auVar200._20_4_ * fVar184;
    auVar54._24_4_ = auVar200._24_4_ * fVar186;
    auVar54._28_4_ = auVar38._28_4_;
    auVar55._4_4_ = fVar203 * fVar207;
    auVar55._0_4_ = fVar203 * fVar202;
    auVar55._8_4_ = fVar203 * fVar209;
    auVar55._12_4_ = fVar203 * fVar210;
    auVar55._16_4_ = fVar203 * fVar211;
    auVar55._20_4_ = fVar203 * fVar212;
    auVar55._24_4_ = fVar203 * fVar213;
    auVar55._28_4_ = local_360._28_4_;
    auVar33 = vsubps_avx(auVar54,auVar55);
    auVar96._0_4_ =
         auVar32._0_4_ * auVar32._0_4_ +
         auVar36._0_4_ * auVar36._0_4_ + auVar33._0_4_ * auVar33._0_4_;
    auVar96._4_4_ =
         auVar32._4_4_ * auVar32._4_4_ +
         auVar36._4_4_ * auVar36._4_4_ + auVar33._4_4_ * auVar33._4_4_;
    auVar96._8_4_ =
         auVar32._8_4_ * auVar32._8_4_ +
         auVar36._8_4_ * auVar36._8_4_ + auVar33._8_4_ * auVar33._8_4_;
    auVar96._12_4_ =
         auVar32._12_4_ * auVar32._12_4_ +
         auVar36._12_4_ * auVar36._12_4_ + auVar33._12_4_ * auVar33._12_4_;
    auVar96._16_4_ =
         auVar32._16_4_ * auVar32._16_4_ +
         auVar36._16_4_ * auVar36._16_4_ + auVar33._16_4_ * auVar33._16_4_;
    auVar96._20_4_ =
         auVar32._20_4_ * auVar32._20_4_ +
         auVar36._20_4_ * auVar36._20_4_ + auVar33._20_4_ * auVar33._20_4_;
    auVar96._24_4_ =
         auVar32._24_4_ * auVar32._24_4_ +
         auVar36._24_4_ * auVar36._24_4_ + auVar33._24_4_ * auVar33._24_4_;
    auVar96._28_4_ = auVar32._28_4_ + auVar36._28_4_ + auVar33._28_4_;
    auVar56._4_4_ = (float)local_560._4_4_ * (float)local_560._4_4_ * fVar139;
    auVar56._0_4_ = (float)local_560._0_4_ * (float)local_560._0_4_ * fVar134;
    auVar56._8_4_ = fStack_558 * fStack_558 * fVar140;
    auVar56._12_4_ = fStack_554 * fStack_554 * fVar141;
    auVar56._16_4_ = (float)uStack_550 * (float)uStack_550 * fVar142;
    auVar56._20_4_ = uStack_550._4_4_ * uStack_550._4_4_ * fVar143;
    auVar56._24_4_ = (float)uStack_548 * (float)uStack_548 * fVar144;
    auVar56._28_4_ = uStack_548._4_4_;
    auVar32 = vcmpps_avx(auVar96,auVar56,1);
    auVar57._4_4_ = fVar109 * -fVar207;
    auVar57._0_4_ = fVar92 * -fVar202;
    auVar57._8_4_ = fVar111 * -fVar209;
    auVar57._12_4_ = fVar113 * -fVar210;
    auVar57._16_4_ = fVar115 * -fVar211;
    auVar57._20_4_ = fVar117 * -fVar212;
    auVar57._24_4_ = fVar119 * -fVar213;
    auVar57._28_4_ = -fVar214;
    auVar33 = vblendvps_avx(auVar85,auVar57,auVar32);
    auVar123._16_16_ = *(undefined1 (*) [16])(mm_lookupmask_ps + (line->leftExists & 0xfffffff0));
    auVar123._0_16_ = *(undefined1 (*) [16])(mm_lookupmask_ps + ((line->leftExists & 0xf) << 4));
    auVar32 = vandnps_avx(auVar123,auVar35);
    local_3c0 = vblendvps_avx(auVar85,auVar33,auVar32);
    auVar97._12_4_ = fStack_2f4;
    auVar97._0_12_ = *(undefined1 (*) [12])(mm_lookupmask_ps + uVar79);
    auVar97._16_16_ = *(undefined1 (*) [16])(mm_lookupmask_ps + (line->rightExists & 0xfffffff0));
    auVar58._4_4_ = auVar200._4_4_ * auVar42._4_4_;
    auVar58._0_4_ = auVar200._0_4_ * auVar42._0_4_;
    auVar58._8_4_ = auVar200._8_4_ * auVar42._8_4_;
    auVar58._12_4_ = auVar200._12_4_ * auVar42._12_4_;
    auVar58._16_4_ = auVar200._16_4_ * auVar42._16_4_;
    auVar58._20_4_ = auVar200._20_4_ * auVar42._20_4_;
    auVar58._24_4_ = auVar200._24_4_ * auVar42._24_4_;
    auVar58._28_4_ = auVar32._28_4_;
    auVar59._4_4_ = auVar200._4_4_ * auVar43._4_4_;
    auVar59._0_4_ = auVar200._0_4_ * auVar43._0_4_;
    auVar59._8_4_ = auVar200._8_4_ * auVar43._8_4_;
    auVar59._12_4_ = auVar200._12_4_ * auVar43._12_4_;
    auVar59._16_4_ = auVar200._16_4_ * auVar43._16_4_;
    auVar59._20_4_ = auVar200._20_4_ * auVar43._20_4_;
    auVar59._24_4_ = auVar200._24_4_ * auVar43._24_4_;
    auVar59._28_4_ = auVar36._28_4_;
    auVar105._0_4_ = auVar200._0_4_ * auVar44._0_4_;
    auVar105._4_4_ = auVar200._4_4_ * auVar44._4_4_;
    auVar105._8_4_ = auVar200._8_4_ * auVar44._8_4_;
    auVar105._12_4_ = auVar200._12_4_ * auVar44._12_4_;
    auVar105._16_4_ = auVar200._16_4_ * auVar44._16_4_;
    auVar105._20_4_ = auVar200._20_4_ * auVar44._20_4_;
    auVar105._24_4_ = auVar200._24_4_ * auVar44._24_4_;
    auVar105._28_4_ = 0;
    auVar60._4_4_ = local_120 * fVar176;
    auVar60._0_4_ = local_120 * fVar170;
    auVar60._8_4_ = local_120 * fVar177;
    auVar60._12_4_ = local_120 * fVar179;
    auVar60._16_4_ = local_120 * fVar181;
    auVar60._20_4_ = local_120 * fVar183;
    auVar60._24_4_ = local_120 * fVar185;
    auVar60._28_4_ = fStack_504;
    auVar32 = vsubps_avx(auVar58,auVar60);
    auVar61._4_4_ = fVar215 * fVar176;
    auVar61._0_4_ = fVar215 * fVar170;
    auVar61._8_4_ = fVar215 * fVar177;
    auVar61._12_4_ = fVar215 * fVar179;
    auVar61._16_4_ = fVar215 * fVar181;
    auVar61._20_4_ = fVar215 * fVar183;
    auVar61._24_4_ = fVar215 * fVar185;
    auVar61._28_4_ = fStack_504;
    auVar33 = vsubps_avx(auVar59,auVar61);
    auVar62._4_4_ = fVar203 * fVar176;
    auVar62._0_4_ = fVar203 * fVar170;
    auVar62._8_4_ = fVar203 * fVar177;
    auVar62._12_4_ = fVar203 * fVar179;
    auVar62._16_4_ = fVar203 * fVar181;
    auVar62._20_4_ = fVar203 * fVar183;
    auVar62._24_4_ = fVar203 * fVar185;
    auVar62._28_4_ = fStack_504;
    auVar38 = vsubps_avx(auVar105,auVar62);
    auVar106._0_4_ =
         auVar32._0_4_ * auVar32._0_4_ +
         auVar33._0_4_ * auVar33._0_4_ + auVar38._0_4_ * auVar38._0_4_;
    auVar106._4_4_ =
         auVar32._4_4_ * auVar32._4_4_ +
         auVar33._4_4_ * auVar33._4_4_ + auVar38._4_4_ * auVar38._4_4_;
    auVar106._8_4_ =
         auVar32._8_4_ * auVar32._8_4_ +
         auVar33._8_4_ * auVar33._8_4_ + auVar38._8_4_ * auVar38._8_4_;
    auVar106._12_4_ =
         auVar32._12_4_ * auVar32._12_4_ +
         auVar33._12_4_ * auVar33._12_4_ + auVar38._12_4_ * auVar38._12_4_;
    auVar106._16_4_ =
         auVar32._16_4_ * auVar32._16_4_ +
         auVar33._16_4_ * auVar33._16_4_ + auVar38._16_4_ * auVar38._16_4_;
    auVar106._20_4_ =
         auVar32._20_4_ * auVar32._20_4_ +
         auVar33._20_4_ * auVar33._20_4_ + auVar38._20_4_ * auVar38._20_4_;
    auVar106._24_4_ =
         auVar32._24_4_ * auVar32._24_4_ +
         auVar33._24_4_ * auVar33._24_4_ + auVar38._24_4_ * auVar38._24_4_;
    auVar106._28_4_ = auVar32._28_4_ + auVar33._28_4_ + auVar38._28_4_;
    auVar63._4_4_ = fVar139 * auVar81._4_4_ * auVar81._4_4_;
    auVar63._0_4_ = fVar134 * auVar81._0_4_ * auVar81._0_4_;
    auVar63._8_4_ = fVar140 * auVar81._8_4_ * auVar81._8_4_;
    auVar63._12_4_ = fVar141 * auVar81._12_4_ * auVar81._12_4_;
    auVar63._16_4_ = fVar142 * auVar82._16_4_ * auVar82._16_4_;
    auVar63._20_4_ = fVar143 * auVar82._20_4_ * auVar82._20_4_;
    auVar63._24_4_ = fVar144 * auVar82._24_4_ * auVar82._24_4_;
    auVar63._28_4_ = auVar82._28_4_;
    auVar126 = SUB3216(*(undefined1 (*) [32])((long)&(ray->org).field_0 + 0xc),0);
    auVar126 = vshufps_avx(auVar126,auVar126,0);
    auVar130._16_16_ = auVar126;
    auVar130._0_16_ = auVar126;
    auVar32 = vandnps_avx(auVar97,auVar35);
    auVar33 = vcmpps_avx(auVar106,auVar63,1);
    auVar64._4_4_ = fVar109 * -fVar176;
    auVar64._0_4_ = fVar92 * -fVar170;
    auVar64._8_4_ = fVar111 * -fVar177;
    auVar64._12_4_ = fVar113 * -fVar179;
    auVar64._16_4_ = fVar115 * -fVar181;
    auVar64._20_4_ = fVar117 * -fVar183;
    auVar64._24_4_ = fVar119 * -fVar185;
    auVar64._28_4_ = auVar39._28_4_ + auVar34._28_4_;
    auVar33 = vblendvps_avx(auVar85,auVar64,auVar33);
    auVar32 = vblendvps_avx(auVar85,auVar33,auVar32);
    auVar38 = vminps_avx(local_3c0,auVar32);
    auVar33 = vmaxps_avx(local_3c0,auVar32);
    auVar39 = vminps_avx(local_4e0,auVar38);
    auVar34 = vcmpps_avx(auVar39,auVar38,0);
    auVar32 = vcmpps_avx(auVar33,auVar85,0);
    auVar174._8_4_ = 0xff800000;
    auVar174._0_8_ = 0xff800000ff800000;
    auVar174._12_4_ = 0xff800000;
    auVar174._16_4_ = 0xff800000;
    auVar174._20_4_ = 0xff800000;
    auVar174._24_4_ = 0xff800000;
    auVar174._28_4_ = 0xff800000;
    auVar32 = vblendvps_avx(auVar33,auVar174,auVar32);
    auVar33 = vcmpps_avx(auVar38,auVar85,0);
    auVar33 = vblendvps_avx(auVar38,auVar174,auVar33);
    auVar33 = vblendvps_avx(auVar33,auVar32,auVar34);
    auVar107._0_4_ = local_480 + auVar39._0_4_;
    auVar107._4_4_ = fStack_47c + auVar39._4_4_;
    auVar107._8_4_ = fStack_478 + auVar39._8_4_;
    auVar107._12_4_ = fStack_474 + auVar39._12_4_;
    auVar107._16_4_ = fStack_470 + auVar39._16_4_;
    auVar107._20_4_ = fStack_46c + auVar39._20_4_;
    auVar107._24_4_ = fStack_468 + auVar39._24_4_;
    auVar107._28_4_ = fStack_464 + auVar39._28_4_;
    auVar32 = vcmpps_avx(auVar130,auVar107,2);
    auVar126._0_4_ = ray->tfar;
    auVar126._4_4_ = ray->mask;
    auVar126._8_4_ = ray->id;
    auVar126._12_4_ = ray->flags;
    auVar126 = vpermilps_avx(auVar126,0);
    auVar135._16_16_ = auVar126;
    auVar135._0_16_ = auVar126;
    auVar34 = vcmpps_avx(auVar107,auVar135,2);
    auVar32 = vandps_avx(auVar34,auVar32);
    local_2c0 = vmaxps_avx(local_500,auVar33);
    auVar33 = vcmpps_avx(auVar39,auVar85,4);
    auVar33 = vandps_avx(auVar35,auVar33);
    local_460 = vandps_avx(auVar32,auVar33);
    auVar175._0_4_ = local_480 + local_2c0._0_4_;
    auVar175._4_4_ = fStack_47c + local_2c0._4_4_;
    auVar175._8_4_ = fStack_478 + local_2c0._8_4_;
    auVar175._12_4_ = fStack_474 + local_2c0._12_4_;
    auVar175._16_4_ = fStack_470 + local_2c0._16_4_;
    auVar175._20_4_ = fStack_46c + local_2c0._20_4_;
    auVar175._24_4_ = fStack_468 + local_2c0._24_4_;
    auVar175._28_4_ = fStack_464 + local_2c0._28_4_;
    auVar32 = vcmpps_avx(auVar130,auVar175,2);
    auVar33 = vcmpps_avx(auVar175,auVar135,2);
    auVar32 = vandps_avx(auVar33,auVar32);
    auVar33 = vcmpps_avx(auVar174,local_2c0,4);
    auVar33 = vandps_avx(auVar35,auVar33);
    local_280 = vandps_avx(auVar32,auVar33);
    local_2a0 = vorps_avx(local_460,local_280);
    if ((((((((local_2a0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_2a0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_2a0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_2a0 >> 0x7f,0) != '\0') ||
          (local_2a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_2a0 >> 0xbf,0) != '\0') ||
        (local_2a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_2a0[0x1f] < '\0') {
      auVar34 = vblendvps_avx(local_2c0,auVar39,local_460);
      auVar38 = vblendvps_avx(_local_3a0,auVar101,local_460);
      fVar117 = (float)local_520._0_4_ * fVar108 * (float)local_560._0_4_;
      fVar119 = (float)local_520._4_4_ * fVar217 * (float)local_560._4_4_;
      fVar134 = fStack_518 * fVar154 * fStack_558;
      fVar139 = fStack_514 * fVar169 * fStack_554;
      fVar140 = fStack_510 * fVar20 * (float)uStack_550;
      fVar141 = fStack_50c * fVar25 * uStack_550._4_4_;
      fVar142 = fStack_508 * fVar30 * (float)uStack_548;
      auVar32 = vcmpps_avx(auVar34,local_4e0,0);
      auVar33 = vcmpps_avx(auVar34,local_500,0);
      auVar32 = vorps_avx(auVar32,auVar33);
      auVar32 = vandps_avx(auVar35,auVar32);
      auVar39 = vcmpps_avx(local_3c0,auVar34,0);
      auVar33 = vandps_avx(auVar35,auVar39);
      fVar108 = auVar34._0_4_;
      fVar154 = auVar34._4_4_;
      fVar20 = auVar34._8_4_;
      fVar25 = auVar34._12_4_;
      fVar30 = auVar34._16_4_;
      fVar109 = auVar34._20_4_;
      fVar113 = auVar34._24_4_;
      _local_560 = auVar175;
      local_300 = fVar91 * fVar117;
      fStack_2fc = fVar114 * fVar119;
      fStack_2f8 = fVar220 * fVar134;
      fStack_2f4 = fVar163 * fVar139;
      fStack_2f0 = fVar18 * fVar140;
      fStack_2ec = fVar23 * fVar141;
      fStack_2e8 = fVar28 * fVar142;
      fStack_2e4 = local_120;
      auVar124._0_4_ = fVar91 * fVar117 + fVar146 * (fVar145 + local_120 * fVar108);
      auVar124._4_4_ = fVar114 * fVar119 + fVar153 * (fVar152 + local_120 * fVar154);
      auVar124._8_4_ = fVar220 * fVar134 + fVar156 * (fVar155 + local_120 * fVar20);
      auVar124._12_4_ = fVar163 * fVar139 + fVar159 * (fVar158 + local_120 * fVar25);
      auVar124._16_4_ = fVar18 * fVar140 + fVar162 * (fVar161 + local_120 * fVar30);
      auVar124._20_4_ = fVar23 * fVar141 + fVar165 * (fVar164 + local_120 * fVar109);
      auVar124._24_4_ = fVar28 * fVar142 + fVar168 * (fVar167 + local_120 * fVar113);
      auVar124._28_4_ = local_120 + fVar197 + auVar39._28_4_;
      fStack_31c = fVar114 * fVar191;
      local_320 = fVar91 * fVar188;
      fStack_318 = fVar220 * fVar192;
      fStack_314 = fVar163 * fVar193;
      fStack_310 = fVar18 * fVar194;
      fStack_30c = fVar23 * fVar195;
      fStack_308 = fVar28 * fVar196;
      fStack_304 = fStack_504;
      fVar217 = auVar38._0_4_;
      fVar169 = auVar38._4_4_;
      auVar65._4_4_ = fVar114 * fVar191 * fVar169;
      auVar65._0_4_ = fVar91 * fVar188 * fVar217;
      fVar91 = auVar38._8_4_;
      auVar65._8_4_ = fVar220 * fVar192 * fVar91;
      fVar114 = auVar38._12_4_;
      auVar65._12_4_ = fVar163 * fVar193 * fVar114;
      fVar92 = auVar38._16_4_;
      auVar65._16_4_ = fVar18 * fVar194 * fVar92;
      fVar111 = auVar38._20_4_;
      auVar65._20_4_ = fVar23 * fVar195 * fVar111;
      fVar115 = auVar38._24_4_;
      auVar65._24_4_ = fVar28 * fVar196 * fVar115;
      auVar65._28_4_ = local_120;
      auVar38 = vsubps_avx(auVar124,auVar65);
      local_a0._0_8_ = local_440._0_8_ ^ 0x8000000080000000;
      local_a0._8_4_ = -fVar220;
      local_a0._12_4_ = -fVar163;
      local_a0._16_4_ = -fVar18;
      local_a0._20_4_ = -fVar23;
      local_a0._24_4_ = -fVar28;
      local_a0._28_4_ = -fVar45;
      auVar35 = vblendvps_avx(local_440,local_a0,auVar33);
      local_380 = vblendvps_avx(auVar35,auVar38,auVar32);
      fStack_64 = local_380._28_4_;
      local_80 = fVar208 * fVar117;
      fStack_7c = fVar112 * fVar119;
      fStack_78 = fVar219 * fVar134;
      fStack_74 = fVar160 * fVar139;
      fStack_70 = fVar17 * fVar140;
      fStack_6c = fVar22 * fVar141;
      fStack_68 = fVar27 * fVar142;
      auVar125._0_4_ = fVar208 * fVar117 + fVar146 * (fVar215 * fVar108 + fVar102);
      auVar125._4_4_ = fVar112 * fVar119 + fVar153 * (fVar215 * fVar154 + fVar118);
      auVar125._8_4_ = fVar219 * fVar134 + fVar156 * (fVar215 * fVar20 + fVar147);
      auVar125._12_4_ = fVar160 * fVar139 + fVar159 * (fVar215 * fVar25 + fVar166);
      auVar125._16_4_ = fVar17 * fVar140 + fVar162 * (fVar215 * fVar30 + fVar19);
      auVar125._20_4_ = fVar22 * fVar141 + fVar165 * (fVar215 * fVar109 + fVar24);
      auVar125._24_4_ = fVar27 * fVar142 + fVar168 * (fVar215 * fVar113 + fVar29);
      auVar125._28_4_ = fStack_64 + auVar38._28_4_ + local_360._28_4_;
      fStack_33c = fVar191 * fVar112;
      local_340 = fVar188 * fVar208;
      fStack_338 = fVar192 * fVar219;
      fStack_334 = fVar193 * fVar160;
      fStack_330 = fVar194 * fVar17;
      fStack_32c = fVar195 * fVar22;
      fStack_328 = fVar196 * fVar27;
      fStack_324 = fStack_64;
      auVar66._4_4_ = fVar191 * fVar112 * fVar169;
      auVar66._0_4_ = fVar188 * fVar208 * fVar217;
      auVar66._8_4_ = fVar192 * fVar219 * fVar91;
      auVar66._12_4_ = fVar193 * fVar160 * fVar114;
      auVar66._16_4_ = fVar194 * fVar17 * fVar92;
      auVar66._20_4_ = fVar195 * fVar22 * fVar111;
      auVar66._24_4_ = fVar196 * fVar27 * fVar115;
      auVar66._28_4_ = auVar175._28_4_;
      auVar38 = vsubps_avx(auVar125,auVar66);
      local_e0._0_8_ = local_160._0_8_ ^ 0x8000000080000000;
      local_e0._8_4_ = -fVar219;
      local_e0._12_4_ = -fVar160;
      local_e0._16_4_ = -fVar17;
      local_e0._20_4_ = -fVar22;
      local_e0._24_4_ = -fVar27;
      local_e0._28_4_ = local_160._28_4_ ^ 0x80000000;
      auVar35 = vblendvps_avx(local_160,local_e0,auVar33);
      local_1c0 = vblendvps_avx(auVar35,auVar38,auVar32);
      local_c0 = fVar187 * fVar117;
      fStack_bc = fVar110 * fVar119;
      fStack_b8 = fVar218 * fVar134;
      fStack_b4 = fVar157 * fVar139;
      fStack_b0 = fVar16 * fVar140;
      fStack_ac = fVar21 * fVar141;
      fStack_a8 = fVar26 * fVar142;
      fStack_a4 = auVar35._28_4_;
      auVar136._0_4_ = fVar187 * fVar117 + fVar146 * (fVar171 + fVar203 * fVar108);
      auVar136._4_4_ = fVar110 * fVar119 + fVar153 * (fVar116 + fVar203 * fVar154);
      auVar136._8_4_ = fVar218 * fVar134 + fVar156 * (fVar178 + fVar203 * fVar20);
      auVar136._12_4_ = fVar157 * fVar139 + fVar159 * (fVar180 + fVar203 * fVar25);
      auVar136._16_4_ = fVar16 * fVar140 + fVar162 * (fVar182 + fVar203 * fVar30);
      auVar136._20_4_ = fVar21 * fVar141 + fVar165 * (fVar184 + fVar203 * fVar109);
      auVar136._24_4_ = fVar26 * fVar142 + fVar168 * (fVar186 + fVar203 * fVar113);
      auVar136._28_4_ = auVar35._28_4_ + fStack_404 + auVar126._12_4_;
      auVar38 = vrcpps_avx(_local_520);
      local_2e0 = fVar188 * fVar187;
      fStack_2dc = fVar191 * fVar110;
      fStack_2d8 = fVar192 * fVar218;
      fStack_2d4 = fVar193 * fVar157;
      fStack_2d0 = fVar194 * fVar16;
      fStack_2cc = fVar195 * fVar21;
      fStack_2c8 = fVar196 * fVar26;
      uStack_2c4 = local_e0._28_4_;
      auVar67._4_4_ = fVar191 * fVar110 * fVar169;
      auVar67._0_4_ = fVar188 * fVar187 * fVar217;
      auVar67._8_4_ = fVar192 * fVar218 * fVar91;
      auVar67._12_4_ = fVar193 * fVar157 * fVar114;
      auVar67._16_4_ = fVar194 * fVar16 * fVar92;
      auVar67._20_4_ = fVar195 * fVar21 * fVar111;
      auVar67._24_4_ = fVar196 * fVar26 * fVar115;
      auVar67._28_4_ = fVar197;
      auVar39 = vsubps_avx(auVar136,auVar67);
      local_100._0_8_ = local_4a0 ^ 0x8000000080000000;
      local_100._8_4_ = -fVar218;
      local_100._12_4_ = -fVar157;
      local_100._16_4_ = -fVar16;
      local_100._20_4_ = -fVar21;
      local_100._24_4_ = -fVar26;
      local_100._28_4_ = local_4a0._28_4_ ^ 0x80000000;
      auVar35 = vblendvps_avx(_local_4a0,local_100,auVar33);
      local_1a0 = vblendvps_avx(auVar35,auVar39,auVar32);
      fVar187 = auVar38._0_4_;
      fVar208 = auVar38._4_4_;
      auVar68._4_4_ = (float)local_520._4_4_ * fVar208;
      auVar68._0_4_ = (float)local_520._0_4_ * fVar187;
      fVar102 = auVar38._8_4_;
      auVar68._8_4_ = fStack_518 * fVar102;
      fVar110 = auVar38._12_4_;
      auVar68._12_4_ = fStack_514 * fVar110;
      fVar112 = auVar38._16_4_;
      auVar68._16_4_ = fStack_510 * fVar112;
      fVar118 = auVar38._20_4_;
      auVar68._20_4_ = fStack_50c * fVar118;
      fVar218 = auVar38._24_4_;
      auVar68._24_4_ = fStack_508 * fVar218;
      auVar68._28_4_ = local_100._28_4_;
      auVar225._8_4_ = 0x3f800000;
      auVar225._0_8_ = &DAT_3f8000003f800000;
      auVar225._12_4_ = 0x3f800000;
      auVar225._16_4_ = 0x3f800000;
      auVar225._20_4_ = 0x3f800000;
      auVar225._24_4_ = 0x3f800000;
      auVar225._28_4_ = 0x3f800000;
      auVar35 = vsubps_avx(auVar225,auVar68);
      auVar33 = vblendvps_avx(auVar225,ZEXT832(0) << 0x20,auVar33);
      auVar226 = ZEXT3264(auVar33);
      local_520._0_4_ = fVar187 + fVar187 * auVar35._0_4_;
      local_520._4_4_ = fVar208 + fVar208 * auVar35._4_4_;
      fStack_518 = fVar102 + fVar102 * auVar35._8_4_;
      fStack_514 = fVar110 + fVar110 * auVar35._12_4_;
      fStack_510 = fVar112 + fVar112 * auVar35._16_4_;
      fStack_50c = fVar118 + fVar118 * auVar35._20_4_;
      fStack_508 = fVar218 + fVar218 * auVar35._24_4_;
      fStack_504 = auVar38._28_4_ + auVar35._28_4_;
      auVar69._4_4_ = fVar169 * (float)local_520._4_4_;
      auVar69._0_4_ = fVar217 * (float)local_520._0_4_;
      auVar69._8_4_ = fVar91 * fStack_518;
      auVar69._12_4_ = fVar114 * fStack_514;
      auVar69._16_4_ = fVar92 * fStack_510;
      auVar69._20_4_ = fVar111 * fStack_50c;
      auVar69._24_4_ = fVar115 * fStack_508;
      auVar69._28_4_ = auVar35._28_4_;
      local_240 = vblendvps_avx(auVar33,auVar69,auVar32);
      local_200._0_4_ = fVar108 + local_480;
      local_200._4_4_ = fVar154 + fStack_47c;
      local_200._8_4_ = fVar20 + fStack_478;
      local_200._12_4_ = fVar25 + fStack_474;
      local_200._16_4_ = fVar30 + fStack_470;
      local_200._20_4_ = fVar109 + fStack_46c;
      local_200._24_4_ = fVar113 + fStack_468;
      local_200._28_4_ = auVar34._28_4_ + fStack_464;
      local_220 = ZEXT832(0) << 0x20;
      local_1e0 = local_380;
      uVar77 = vmovmskps_avx(local_2a0);
      uVar79 = CONCAT44((int)((ulong)lVar78 >> 0x20),uVar77);
      auVar201 = ZEXT3264(auVar175);
      auVar223 = ZEXT3264(local_440);
      auVar132 = ZEXT3264(local_4e0);
      auVar138 = ZEXT3264(local_500);
      fVar187 = fStack_404;
      fVar208 = fVar203;
      fVar91 = fVar203;
      fVar102 = fVar203;
      fVar108 = fVar203;
      fVar110 = fVar203;
      fVar112 = fVar203;
      fVar114 = fVar215;
      fVar118 = fVar215;
      fVar217 = fVar215;
      fVar218 = fVar215;
      fVar219 = fVar215;
      fVar220 = fVar215;
      _local_420 = auVar83;
      do {
        uVar15 = 0;
        if (uVar79 != 0) {
          for (; (uVar79 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
          }
        }
        pGVar11 = (pSVar80->geometries).items[*(uint *)(local_260 + uVar15 * 4)].ptr;
        if ((pGVar11->mask & ray->mask) == 0) {
LAB_011c622d:
          uVar79 = uVar79 ^ 1L << (uVar15 & 0x3f);
          bVar76 = 1;
        }
        else {
          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
             (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            local_590 = *(undefined4 *)(local_1e0 + uVar15 * 4);
            local_58c = *(undefined4 *)(local_1c0 + uVar15 * 4);
            local_588 = *(undefined4 *)(local_1a0 + uVar15 * 4);
            local_584 = *(undefined4 *)(local_240 + uVar15 * 4);
            local_580 = *(undefined4 *)(local_220 + uVar15 * 4);
            local_57c = (local_538->primIDs).field_0.i[uVar15];
            local_578 = *(uint *)(local_260 + uVar15 * 4);
            local_574 = context->user->instID[0];
            local_570 = context->user->instPrimID[0];
            local_480 = ray->tfar;
            ray->tfar = *(float *)(local_200 + uVar15 * 4);
            local_5cc = -1;
            local_5c0.valid = &local_5cc;
            local_5c0.geometryUserPtr = pGVar11->userPtr;
            local_5c0.context = context->user;
            local_5c0.ray = (RTCRayN *)ray;
            local_5c0.hit = (RTCHitN *)&local_590;
            local_5c0.N = 1;
            local_180 = auVar226._0_32_;
            if (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0) {
              (*pGVar11->occlusionFilterN)(&local_5c0);
              auVar226 = ZEXT3264(local_180);
              auVar201 = ZEXT3264(_local_560);
              auVar138 = ZEXT3264(local_500);
              auVar132 = ZEXT3264(local_4e0);
              auVar223 = ZEXT3264(local_440);
              context = local_5c8;
              pSVar80 = local_530;
              fVar171 = (float)local_420._0_4_;
              fVar116 = (float)local_420._4_4_;
              fVar178 = fStack_418;
              fVar180 = fStack_414;
              fVar182 = fStack_410;
              fVar184 = fStack_40c;
              fVar186 = fStack_408;
              fVar187 = fStack_404;
              fVar145 = (float)local_4c0._0_4_;
              fVar152 = (float)local_4c0._4_4_;
              fVar155 = fStack_4b8;
              fVar158 = fStack_4b4;
              fVar161 = (float)uStack_4b0;
              fVar164 = uStack_4b0._4_4_;
              fVar167 = (float)uStack_4a8;
              fVar197 = uStack_4a8._4_4_;
              fVar203 = local_3e0;
              fVar208 = fStack_3dc;
              fVar91 = fStack_3d8;
              fVar102 = fStack_3d4;
              fVar108 = fStack_3d0;
              fVar110 = fStack_3cc;
              fVar112 = fStack_3c8;
              fVar215 = local_400;
              fVar114 = fStack_3fc;
              fVar118 = fStack_3f8;
              fVar217 = fStack_3f4;
              fVar218 = fStack_3f0;
              fVar219 = fStack_3ec;
              fVar220 = fStack_3e8;
              if (*local_5c0.valid != 0) goto LAB_011c63a2;
LAB_011c6441:
              ray->tfar = local_480;
              goto LAB_011c622d;
            }
LAB_011c63a2:
            p_Var14 = context->args->filter;
            if (p_Var14 != (RTCFilterFunctionN)0x0) {
              if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar11->field_8).field_0x2 & 0x40) != 0)) {
                (*p_Var14)(&local_5c0);
                auVar226 = ZEXT3264(local_180);
                auVar201 = ZEXT3264(_local_560);
                auVar138 = ZEXT3264(local_500);
                auVar132 = ZEXT3264(local_4e0);
                auVar223 = ZEXT3264(local_440);
                context = local_5c8;
                fVar171 = (float)local_420._0_4_;
                fVar116 = (float)local_420._4_4_;
                fVar178 = fStack_418;
                fVar180 = fStack_414;
                fVar182 = fStack_410;
                fVar184 = fStack_40c;
                fVar186 = fStack_408;
                fVar187 = fStack_404;
                fVar145 = (float)local_4c0._0_4_;
                fVar152 = (float)local_4c0._4_4_;
                fVar155 = fStack_4b8;
                fVar158 = fStack_4b4;
                fVar161 = (float)uStack_4b0;
                fVar164 = uStack_4b0._4_4_;
                fVar167 = (float)uStack_4a8;
                fVar197 = uStack_4a8._4_4_;
                fVar203 = local_3e0;
                fVar208 = fStack_3dc;
                fVar91 = fStack_3d8;
                fVar102 = fStack_3d4;
                fVar108 = fStack_3d0;
                fVar110 = fStack_3cc;
                fVar112 = fStack_3c8;
                fVar215 = local_400;
                fVar114 = fStack_3fc;
                fVar118 = fStack_3f8;
                fVar217 = fStack_3f4;
                fVar218 = fStack_3f0;
                fVar219 = fStack_3ec;
                fVar220 = fStack_3e8;
              }
              if (*local_5c0.valid == 0) goto LAB_011c6441;
            }
          }
          bVar76 = 0;
        }
      } while ((bVar76 != 0) && (uVar79 != 0));
      auVar32 = vandps_avx(local_280,local_460);
      fVar147 = ray->tfar;
      auVar90._4_4_ = fVar147;
      auVar90._0_4_ = fVar147;
      auVar90._8_4_ = fVar147;
      auVar90._12_4_ = fVar147;
      auVar90._16_4_ = fVar147;
      auVar90._20_4_ = fVar147;
      auVar90._24_4_ = fVar147;
      auVar90._28_4_ = fVar147;
      auVar33 = vcmpps_avx(auVar201._0_32_,auVar90,2);
      auVar34 = auVar32 & auVar33;
      if ((((((((auVar34 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar34 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar34 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar34 >> 0x7f,0) == '\0') &&
            (auVar34 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar34 >> 0xbf,0) == '\0') &&
          (auVar34 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar34[0x1f])
      {
        return (bool)(bVar76 ^ 1);
      }
      auVar38 = vcmpps_avx(local_2c0,local_3c0,0);
      auVar34 = vblendvps_avx(auVar223._0_32_,local_a0,auVar38);
      auVar35 = vblendvps_avx(local_160,local_e0,auVar38);
      auVar38 = vblendvps_avx(_local_4a0,local_100,auVar38);
      auVar39 = vcmpps_avx(local_2c0,auVar132._0_32_,0);
      auVar42 = vcmpps_avx(local_2c0,auVar138._0_32_,0);
      auVar39 = vorps_avx(auVar39,auVar42);
      fVar147 = local_2c0._0_4_;
      fVar154 = local_2c0._4_4_;
      fVar157 = local_2c0._8_4_;
      fVar160 = local_2c0._12_4_;
      fVar163 = local_2c0._16_4_;
      fVar166 = local_2c0._20_4_;
      fVar169 = local_2c0._24_4_;
      auVar131._0_4_ = (float)local_140._0_4_ * (fVar145 + fVar147 * local_120) + local_300;
      auVar131._4_4_ = (float)local_140._4_4_ * (fVar152 + fVar154 * fStack_11c) + fStack_2fc;
      auVar131._8_4_ = fStack_138 * (fVar155 + fVar157 * fStack_118) + fStack_2f8;
      auVar131._12_4_ = fStack_134 * (fVar158 + fVar160 * fStack_114) + fStack_2f4;
      auVar131._16_4_ = fStack_130 * (fVar161 + fVar163 * fStack_110) + fStack_2f0;
      auVar131._20_4_ = fStack_12c * (fVar164 + fVar166 * fStack_10c) + fStack_2ec;
      auVar131._24_4_ = fStack_128 * (fVar167 + fVar169 * fStack_108) + fStack_2e8;
      auVar131._28_4_ = fVar197 + auVar42._28_4_ + fStack_2e4;
      auVar137._0_4_ =
           (float)local_140._0_4_ * (fVar215 * fVar147 + (float)local_360._0_4_) + local_80;
      auVar137._4_4_ =
           (float)local_140._4_4_ * (fVar114 * fVar154 + (float)local_360._4_4_) + fStack_7c;
      auVar137._8_4_ = fStack_138 * (fVar118 * fVar157 + fStack_358) + fStack_78;
      auVar137._12_4_ = fStack_134 * (fVar217 * fVar160 + fStack_354) + fStack_74;
      auVar137._16_4_ = fStack_130 * (fVar218 * fVar163 + fStack_350) + fStack_70;
      auVar137._20_4_ = fStack_12c * (fVar219 * fVar166 + fStack_34c) + fStack_6c;
      auVar137._24_4_ = fStack_128 * (fVar220 * fVar169 + fStack_348) + fStack_68;
      auVar137._28_4_ = auVar138._28_4_ + fStack_344 + fStack_64;
      auVar151._0_4_ = (float)local_140._0_4_ * (fVar171 + fVar203 * fVar147) + local_c0;
      auVar151._4_4_ = (float)local_140._4_4_ * (fVar116 + fVar208 * fVar154) + fStack_bc;
      auVar151._8_4_ = fStack_138 * (fVar178 + fVar91 * fVar157) + fStack_b8;
      auVar151._12_4_ = fStack_134 * (fVar180 + fVar102 * fVar160) + fStack_b4;
      auVar151._16_4_ = fStack_130 * (fVar182 + fVar108 * fVar163) + fStack_b0;
      auVar151._20_4_ = fStack_12c * (fVar184 + fVar110 * fVar166) + fStack_ac;
      auVar151._24_4_ = fStack_128 * (fVar186 + fVar112 * fVar169) + fStack_a8;
      auVar151._28_4_ = fVar187 + local_2c0._28_4_ + fStack_a4;
      auVar70._4_4_ = (float)local_3a0._4_4_ * fStack_31c;
      auVar70._0_4_ = (float)local_3a0._0_4_ * local_320;
      auVar70._8_4_ = fStack_398 * fStack_318;
      auVar70._12_4_ = fStack_394 * fStack_314;
      auVar70._16_4_ = fStack_390 * fStack_310;
      auVar70._20_4_ = fStack_38c * fStack_30c;
      auVar70._24_4_ = fStack_388 * fStack_308;
      auVar70._28_4_ = uStack_124;
      auVar42 = vsubps_avx(auVar131,auVar70);
      auVar71._4_4_ = (float)local_3a0._4_4_ * fStack_33c;
      auVar71._0_4_ = (float)local_3a0._0_4_ * local_340;
      auVar71._8_4_ = fStack_398 * fStack_338;
      auVar71._12_4_ = fStack_394 * fStack_334;
      auVar71._16_4_ = fStack_390 * fStack_330;
      auVar71._20_4_ = fStack_38c * fStack_32c;
      auVar71._24_4_ = fStack_388 * fStack_328;
      auVar71._28_4_ = uStack_124;
      auVar43 = vsubps_avx(auVar137,auVar71);
      auVar72._4_4_ = (float)local_3a0._4_4_ * fStack_2dc;
      auVar72._0_4_ = (float)local_3a0._0_4_ * local_2e0;
      auVar72._8_4_ = fStack_398 * fStack_2d8;
      auVar72._12_4_ = fStack_394 * fStack_2d4;
      auVar72._16_4_ = fStack_390 * fStack_2d0;
      auVar72._20_4_ = fStack_38c * fStack_2cc;
      auVar72._24_4_ = fStack_388 * fStack_2c8;
      auVar72._28_4_ = uStack_124;
      auVar44 = vsubps_avx(auVar151,auVar72);
      local_1e0 = vblendvps_avx(auVar34,auVar42,auVar39);
      local_1c0 = vblendvps_avx(auVar35,auVar43,auVar39);
      local_1a0 = vblendvps_avx(auVar38,auVar44,auVar39);
      auVar73._4_4_ = (float)local_3a0._4_4_ * (float)local_520._4_4_;
      auVar73._0_4_ = (float)local_3a0._0_4_ * (float)local_520._0_4_;
      auVar73._8_4_ = fStack_398 * fStack_518;
      auVar73._12_4_ = fStack_394 * fStack_514;
      auVar73._16_4_ = fStack_390 * fStack_510;
      auVar73._20_4_ = fStack_38c * fStack_50c;
      auVar73._24_4_ = fStack_388 * fStack_508;
      auVar73._28_4_ = auVar42._28_4_;
      local_240 = vblendvps_avx(auVar226._0_32_,auVar73,auVar39);
      auVar32 = vandps_avx(auVar33,auVar32);
      local_220 = ZEXT832(0) << 0x20;
      local_200 = auVar201._0_32_;
      uVar77 = vmovmskps_avx(auVar32);
      uVar79 = CONCAT44((int)(uVar79 >> 0x20),uVar77);
      pSVar80 = context->scene;
      do {
        uVar15 = 0;
        if (uVar79 != 0) {
          for (; (uVar79 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
          }
        }
        pGVar11 = (pSVar80->geometries).items[*(uint *)(local_260 + uVar15 * 4)].ptr;
        if ((pGVar11->mask & ray->mask) == 0) {
LAB_011c6607:
          uVar79 = uVar79 ^ 1L << (uVar15 & 0x3f);
          bVar74 = 1;
        }
        else {
          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
             (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            local_590 = *(undefined4 *)(local_1e0 + uVar15 * 4);
            local_58c = *(undefined4 *)(local_1c0 + uVar15 * 4);
            local_588 = *(undefined4 *)(local_1a0 + uVar15 * 4);
            local_584 = *(undefined4 *)(local_240 + uVar15 * 4);
            local_580 = *(undefined4 *)(local_220 + uVar15 * 4);
            local_57c = (local_538->primIDs).field_0.i[uVar15];
            local_578 = *(uint *)(local_260 + uVar15 * 4);
            local_574 = context->user->instID[0];
            local_570 = context->user->instPrimID[0];
            local_560._0_4_ = ray->tfar;
            ray->tfar = *(float *)(local_200 + uVar15 * 4);
            local_5cc = -1;
            local_5c0.valid = &local_5cc;
            local_5c0.geometryUserPtr = pGVar11->userPtr;
            local_5c0.context = context->user;
            local_5c0.ray = (RTCRayN *)ray;
            local_5c0.hit = (RTCHitN *)&local_590;
            local_5c0.N = 1;
            if ((pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0) &&
               ((*pGVar11->occlusionFilterN)(&local_5c0), context = local_5c8, ray = local_528,
               *local_5c0.valid == 0)) {
LAB_011c675e:
              ray->tfar = (float)local_560._0_4_;
              goto LAB_011c6607;
            }
            p_Var14 = context->args->filter;
            if (p_Var14 != (RTCFilterFunctionN)0x0) {
              if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar11->field_8).field_0x2 & 0x40) != 0)) {
                (*p_Var14)(&local_5c0);
                context = local_5c8;
              }
              if (*local_5c0.valid == 0) goto LAB_011c675e;
            }
          }
          bVar74 = 0;
        }
        if ((bVar74 == 0) || (uVar79 == 0)) {
          return (bool)(bVar76 ^ 1 | bVar74 ^ 1);
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& line)
      {
        STAT3(shadow.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; 
        vbool<M> cL,cR;
        line.gather(v0,v1,cL,cR,geom,ray.time());
        const vbool<M> valid = line.valid();
        return ConeCurveIntersector1<M>::intersect(valid,ray,context,geom,pre,v0,v1,cL,cR,Occluded1EpilogM<M,filter>(ray,context,line.geomID(),line.primID()));
        return false;
      }